

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

void __thiscall glslang::TShaderQualifiers::merge(TShaderQualifiers *this,TShaderQualifiers *src)

{
  int i;
  long lVar1;
  bool bVar2;
  
  if (src->geometry != ElgNone) {
    this->geometry = src->geometry;
  }
  if (src->pixelCenterInteger == true) {
    this->pixelCenterInteger = true;
  }
  if (src->originUpperLeft == true) {
    this->originUpperLeft = true;
  }
  if (src->invocations != -1) {
    this->invocations = src->invocations;
  }
  if (src->vertices != -1) {
    this->vertices = src->vertices;
  }
  if (src->spacing != EvsNone) {
    this->spacing = src->spacing;
  }
  if (src->order != EvoNone) {
    this->order = src->order;
  }
  if (src->pointMode == true) {
    this->pointMode = true;
  }
  lVar1 = 0;
  do {
    if (1 < src->localSize[lVar1]) {
      this->localSize[lVar1] = src->localSize[lVar1];
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    bVar2 = true;
    if (src->localSizeNotDefault[lVar1] == false) {
      bVar2 = this->localSizeNotDefault[lVar1];
    }
    this->localSizeNotDefault[lVar1] = bVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    if (src->localSizeSpecId[lVar1] != -1) {
      this->localSizeSpecId[lVar1] = src->localSizeSpecId[lVar1];
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (src->earlyFragmentTests != false) {
    this->earlyFragmentTests = true;
  }
  if (src->earlyAndLateFragmentTestsAMD == true) {
    this->earlyAndLateFragmentTestsAMD = true;
  }
  if (src->postDepthCoverage == true) {
    this->postDepthCoverage = true;
  }
  if (src->nonCoherentColorAttachmentReadEXT == true) {
    this->nonCoherentColorAttachmentReadEXT = true;
  }
  if (src->nonCoherentDepthAttachmentReadEXT == true) {
    this->nonCoherentDepthAttachmentReadEXT = true;
  }
  if (src->nonCoherentStencilAttachmentReadEXT == true) {
    this->nonCoherentStencilAttachmentReadEXT = true;
  }
  if (src->layoutDepth != EldNone) {
    this->layoutDepth = src->layoutDepth;
  }
  if (src->layoutStencil != ElsNone) {
    this->layoutStencil = src->layoutStencil;
  }
  if (src->blendEquation == true) {
    this->blendEquation = true;
  }
  if (src->numViews != -1) {
    this->numViews = src->numViews;
  }
  if (src->layoutOverrideCoverage == true) {
    this->layoutOverrideCoverage = true;
  }
  if (src->layoutDerivativeGroupQuads == true) {
    this->layoutDerivativeGroupQuads = true;
  }
  if (src->layoutDerivativeGroupLinear == true) {
    this->layoutDerivativeGroupLinear = true;
  }
  if (src->primitives != -1) {
    this->primitives = src->primitives;
  }
  if (src->interlockOrdering != EioNone) {
    this->interlockOrdering = src->interlockOrdering;
  }
  if (src->layoutPrimitiveCulling == true) {
    this->layoutPrimitiveCulling = true;
  }
  return;
}

Assistant:

void merge(const TShaderQualifiers& src)
    {
        if (src.geometry != ElgNone)
            geometry = src.geometry;
        if (src.pixelCenterInteger)
            pixelCenterInteger = src.pixelCenterInteger;
        if (src.originUpperLeft)
            originUpperLeft = src.originUpperLeft;
        if (src.invocations != TQualifier::layoutNotSet)
            invocations = src.invocations;
        if (src.vertices != TQualifier::layoutNotSet)
            vertices = src.vertices;
        if (src.spacing != EvsNone)
            spacing = src.spacing;
        if (src.order != EvoNone)
            order = src.order;
        if (src.pointMode)
            pointMode = true;
        for (int i = 0; i < 3; ++i) {
            if (src.localSize[i] > 1)
                localSize[i] = src.localSize[i];
        }
        for (int i = 0; i < 3; ++i) {
            localSizeNotDefault[i] = src.localSizeNotDefault[i] || localSizeNotDefault[i];
        }
        for (int i = 0; i < 3; ++i) {
            if (src.localSizeSpecId[i] != TQualifier::layoutNotSet)
                localSizeSpecId[i] = src.localSizeSpecId[i];
        }
        if (src.earlyFragmentTests)
            earlyFragmentTests = true;
        if (src.earlyAndLateFragmentTestsAMD)
            earlyAndLateFragmentTestsAMD = true;
        if (src.postDepthCoverage)
            postDepthCoverage = true;
        if (src.nonCoherentColorAttachmentReadEXT)
            nonCoherentColorAttachmentReadEXT = true;
        if (src.nonCoherentDepthAttachmentReadEXT)
            nonCoherentDepthAttachmentReadEXT = true;
        if (src.nonCoherentStencilAttachmentReadEXT)
            nonCoherentStencilAttachmentReadEXT = true;
        if (src.layoutDepth)
            layoutDepth = src.layoutDepth;
        if (src.layoutStencil)
            layoutStencil = src.layoutStencil;
        if (src.blendEquation)
            blendEquation = src.blendEquation;
        if (src.numViews != TQualifier::layoutNotSet)
            numViews = src.numViews;
        if (src.layoutOverrideCoverage)
            layoutOverrideCoverage = src.layoutOverrideCoverage;
        if (src.layoutDerivativeGroupQuads)
            layoutDerivativeGroupQuads = src.layoutDerivativeGroupQuads;
        if (src.layoutDerivativeGroupLinear)
            layoutDerivativeGroupLinear = src.layoutDerivativeGroupLinear;
        if (src.primitives != TQualifier::layoutNotSet)
            primitives = src.primitives;
        if (src.interlockOrdering != EioNone)
            interlockOrdering = src.interlockOrdering;
        if (src.layoutPrimitiveCulling)
            layoutPrimitiveCulling = src.layoutPrimitiveCulling;
    }